

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi_dec_test.c
# Opt level: O0

int main(int argc,char **argv)

{
  float local_28c;
  MpiDecTestCmd *cmd;
  MpiDecTestCmd cmd_ctx;
  RK_S32 ret;
  char **argv_local;
  int argc_local;
  
  cmd_ctx.file_slt._4_4_ = 0;
  memset((MpiDecTestCmd *)&cmd,0,0x260);
  cmd_ctx.file_output[0xfc] = '\x11';
  cmd_ctx.file_output[0xfd] = '\0';
  cmd_ctx.file_output[0xfe] = '\x01';
  cmd_ctx.file_output[0xff] = '\0';
  cmd_ctx.frame_num = 0x1000;
  cmd_ctx._548_4_ = 0;
  cmd_ctx.file_slt._4_4_ = mpi_dec_test_cmd_init((MpiDecTestCmd *)&cmd,argc,argv);
  if (cmd_ctx.file_slt._4_4_ == 0) {
    mpi_dec_test_cmd_options((MpiDecTestCmd *)&cmd);
    cmd_ctx.file_slt._4_4_ = dec_decode((MpiDecTestCmd *)&cmd);
    if (cmd_ctx.file_slt._4_4_ == 0) {
      local_28c = (float)(ulong)cmd_ctx._560_8_;
      _mpp_log_l((double)(local_28c / 1048576.0),4,"mpi_dec_test",
                 "test success max memory %.2f MB\n",0);
    }
    else {
      _mpp_log_l(2,"mpi_dec_test","test failed ret %d\n",0,cmd_ctx.file_slt._4_4_);
    }
  }
  mpi_dec_test_cmd_deinit((MpiDecTestCmd *)&cmd);
  return cmd_ctx.file_slt._4_4_;
}

Assistant:

int main(int argc, char **argv)
{
    RK_S32 ret = 0;
    MpiDecTestCmd  cmd_ctx;
    MpiDecTestCmd* cmd = &cmd_ctx;

    memset((void*)cmd, 0, sizeof(*cmd));
    cmd->format = MPP_FMT_BUTT;
    cmd->pkt_size = MPI_DEC_STREAM_SIZE;

    // parse the cmd option
    ret = mpi_dec_test_cmd_init(cmd, argc, argv);
    if (ret)
        goto RET;

    mpi_dec_test_cmd_options(cmd);

    ret = dec_decode(cmd);
    if (MPP_OK == ret)
        mpp_log("test success max memory %.2f MB\n", cmd->max_usage / (float)(1 << 20));
    else
        mpp_err("test failed ret %d\n", ret);

RET:
    mpi_dec_test_cmd_deinit(cmd);

    return ret;
}